

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainControl.cpp
# Opt level: O0

void __thiscall MainControl::start(MainControl *this)

{
  bool bVar1;
  int iVar2;
  int key;
  undefined1 local_40 [8];
  Scene scene;
  MainControl *this_local;
  
  scene._40_8_ = this;
  Scene::Scene((Scene *)local_40,0,0);
  do {
    Scene::update((Scene *)local_40);
    Scene::draw((Scene *)local_40);
    iVar2 = kbhit();
    if (iVar2 != 0) {
      iVar2 = readch();
      if (iVar2 == 0x61) {
        Scene::groundSceneSelectLeft((Scene *)local_40);
      }
      else if (iVar2 == 100) {
        Scene::groundSceneSelectRight((Scene *)local_40);
      }
      else if (iVar2 == 0x77) {
        Scene::groundSceneSelectUp((Scene *)local_40);
      }
      else if (iVar2 == 0x73) {
        Scene::groundSceneSelectDown((Scene *)local_40);
      }
      else if (iVar2 == 0x71) {
        Scene::stateSceneSelectLeft((Scene *)local_40);
      }
      else if (iVar2 == 0x65) {
        Scene::stateSceneSelectRight((Scene *)local_40);
      }
      else if (iVar2 == 0x66) {
        Scene::changeState((Scene *)local_40);
      }
      else if (iVar2 == 0x70) {
        Scene::stopOrContinue((Scene *)local_40);
      }
      else {
        bVar1 = Scene::isStopOrOver((Scene *)local_40);
        if ((bVar1) && (iVar2 == 0x1b)) {
          screenClear();
          std::operator<<((ostream *)&std::cout,"\x1b[0;0H");
          Scene::~Scene((Scene *)local_40);
          return;
        }
        if (iVar2 == 10) {
          Scene::process((Scene *)local_40);
        }
      }
    }
    usleep(this->breakTime * 1000);
  } while( true );
}

Assistant:

void MainControl::start(){
	Scene scene(0, 0);
    while(1){
		scene.update();
		scene.draw();
		if(kbhit()){
			int key = readch();
			/* std::cout << key << std::endl; */
			if(key == 'a'){
				/* std::cout << "left" << std::endl; */
				scene.groundSceneSelectLeft();
			}
			else if(key == 'd'){
				scene.groundSceneSelectRight();
			}
			else if(key == 'w'){
				scene.groundSceneSelectUp();
			}
			else if(key == 's'){
				scene.groundSceneSelectDown();
			}
			else if(key == 'q'){
				scene.stateSceneSelectLeft();
			}
			else if(key == 'e'){
				scene.stateSceneSelectRight();
			}
			else if(key == 'f'){
				scene.changeState();
			}
			else if(key == 'p'){
				scene.stopOrContinue();
			}
			else if(scene.isStopOrOver() && key == 27){
				break;
			}
			else if(key == 10){
				/* std::cout << "enter" << std::endl; */
				scene.process();
			}
        }
        usleep(breakTime*1000);
    }
    screenClear();
    cout << "\033[0;0H";
}